

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::Parser::ParseUninterpretedBlock(Parser *this,string *value)

{
  string *psVar1;
  bool bVar2;
  ulong uVar3;
  allocator local_49;
  string local_48;
  int local_24;
  string *psStack_20;
  int brace_depth;
  string *value_local;
  Parser *this_local;
  
  psStack_20 = value;
  value_local = (string *)this;
  bVar2 = Consume(this,"{");
  if (bVar2) {
    local_24 = 1;
    while (bVar2 = AtEnd(this), ((bVar2 ^ 0xffU) & 1) != 0) {
      bVar2 = LookingAt(this,"{");
      if (bVar2) {
        local_24 = local_24 + 1;
      }
      else {
        bVar2 = LookingAt(this,"}");
        if ((bVar2) && (local_24 = local_24 + -1, local_24 == 0)) {
          io::Tokenizer::Next(this->input_);
          return true;
        }
      }
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        std::__cxx11::string::push_back((char)psStack_20);
      }
      psVar1 = psStack_20;
      io::Tokenizer::current(this->input_);
      std::__cxx11::string::append((string *)psVar1);
      io::Tokenizer::Next(this->input_);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"Unexpected end of stream while parsing aggregate value.",
               &local_49);
    AddError(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  return false;
}

Assistant:

bool Parser::ParseUninterpretedBlock(string* value) {
  // Note that enclosing braces are not added to *value.
  // We do NOT use ConsumeEndOfStatement for this brace because it's delimiting
  // an expression, not a block of statements.
  DO(Consume("{"));
  int brace_depth = 1;
  while (!AtEnd()) {
    if (LookingAt("{")) {
      brace_depth++;
    } else if (LookingAt("}")) {
      brace_depth--;
      if (brace_depth == 0) {
        input_->Next();
        return true;
      }
    }
    // TODO(sanjay): Interpret line/column numbers to preserve formatting
    if (!value->empty()) value->push_back(' ');
    value->append(input_->current().text);
    input_->Next();
  }
  AddError("Unexpected end of stream while parsing aggregate value.");
  return false;
}